

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseRestrictedAlphabet(CFIReaderImpl *this,size_t index,size_t len)

{
  _Alloc_hider _Var1;
  CFIReaderImpl *pCVar2;
  uint uVar3;
  runtime_error *prVar4;
  long in_RCX;
  char *result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  ulong uVar6;
  uint uVar7;
  ulong value;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  shared_ptr<Assimp::FIStringValue> sVar11;
  shared_ptr<const_Assimp::FIValue> sVar12;
  string s;
  string alphabet;
  vector<unsigned_int,_std::allocator<unsigned_int>_> alphabetUTF32;
  string local_c0;
  FIStringValue local_a0;
  utf8 *local_78;
  long local_70;
  utf8 local_68 [16];
  void *local_58;
  long lStack_50;
  undefined8 local_48;
  CFIReaderImpl *local_40;
  size_t local_38;
  
  local_78 = local_68;
  local_70 = 0;
  local_68[0] = (utf8)0x0;
  local_a0.value.field_2._8_8_ = in_RCX;
  if (len < 0x10) {
    if (len == 1) {
      result = "0123456789-:TZ ";
    }
    else {
      if (len != 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        to_string<unsigned_long>((string *)&local_a0,len);
        std::operator+(&local_c0,"Invalid restricted alphabet index ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a0);
        std::runtime_error::runtime_error(prVar4,(string *)&local_c0);
        *(undefined ***)prVar4 = &PTR__runtime_error_00896c98;
        __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      result = "0123456789-+.e ";
    }
    std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,(ulong)result);
  }
  else {
    result = (char *)(*(long *)(index + 0x30) - *(long *)(index + 0x28) >> 5);
    if (result <= (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(len - 0x10)) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>((string *)&local_a0,len);
      std::operator+(&local_c0,"Invalid restricted alphabet index ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0)
      ;
      std::runtime_error::runtime_error(prVar4,(string *)&local_c0);
      *(undefined ***)prVar4 = &PTR__runtime_error_00896c98;
      __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_assign((string *)&local_78);
  }
  local_58 = (void *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  utf8::
  utf8to32<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_78,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(local_78 + local_70),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&local_58,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)result
            );
  value = lStack_50 - (long)local_58 >> 2;
  local_40 = this;
  if (1 < value) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + 1;
    } while (value >> ((byte)uVar8 & 0x3f) != 0);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_38 = index;
    if (local_a0.value.field_2._8_8_ != 0) {
      uVar9 = ~(-1 << ((byte)uVar8 & 0x1f)) & 0xff;
      lVar10 = 0;
      uVar7 = 0;
      uVar6 = 0;
      do {
        uVar7 = (uint)*(byte *)(*(long *)(local_38 + 0x10) + lVar10) | uVar7 << 8;
        uVar6 = uVar6 + 8;
        while (uVar8 <= uVar6) {
          uVar6 = uVar6 - uVar8;
          uVar3 = uVar7 >> ((byte)uVar6 & 0x1f) & uVar9;
          if (uVar3 < value) {
            std::__cxx11::string::push_back((char)&local_c0);
          }
          else if (uVar3 != uVar9) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,(string *)&parseErrorMessage_abi_cxx11_);
            *(undefined ***)prVar4 = &PTR__runtime_error_00896c98;
            __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != local_a0.value.field_2._8_8_);
    }
    sVar11 = FIStringValue::create(&local_a0,&local_c0);
    pCVar2 = local_40;
    _Var1._M_p = local_a0.value._M_dataplus._M_p;
    _Var5 = sVar11.super___shared_ptr<Assimp::FIStringValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
    (local_40->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
         local_a0.super_FIValue._vptr_FIValue;
    (local_40->data)._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    local_a0.value._M_dataplus._M_p = (pointer)0x0;
    (local_40->data)._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)_Var1._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
      _Var5._M_pi = extraout_RDX;
    }
    if (local_58 != (void *)0x0) {
      operator_delete(local_58);
      _Var5._M_pi = extraout_RDX_00;
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
      _Var5._M_pi = extraout_RDX_01;
    }
    sVar12.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    sVar12.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pCVar2;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar12.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  to_string<unsigned_long>((string *)&local_a0,value);
  std::operator+(&local_c0,"Invalid restricted alphabet length ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
  std::runtime_error::runtime_error(prVar4,(string *)&local_c0);
  *(undefined ***)prVar4 = &PTR__runtime_error_00896c98;
  __cxa_throw(prVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<const FIValue> parseRestrictedAlphabet(size_t index, size_t len) {
        std::string alphabet;
        if (index < 16) {
            switch (index) {
            case 0: // numeric
                alphabet = "0123456789-+.e ";
                break;
            case 1: // date and time
                alphabet = "0123456789-:TZ ";
                break;
            default:
                throw DeadlyImportError("Invalid restricted alphabet index " + to_string(index));
            }
        }
        else {
            if (index - 16 >= vocabulary.restrictedAlphabetTable.size()) {
                throw DeadlyImportError("Invalid restricted alphabet index " + to_string(index));
            }
            alphabet = vocabulary.restrictedAlphabetTable[index - 16];
        }
        std::vector<uint32_t> alphabetUTF32;
        utf8::utf8to32(alphabet.begin(), alphabet.end(), back_inserter(alphabetUTF32));
        std::string::size_type alphabetLength = alphabetUTF32.size();
        if (alphabetLength < 2) {
            throw DeadlyImportError("Invalid restricted alphabet length " + to_string(alphabetLength));
        }
        std::string::size_type bitsPerCharacter = 1;
        while ((1ull << bitsPerCharacter) <= alphabetLength) {
            ++bitsPerCharacter;
        }
        size_t bitsAvail = 0;
        uint8_t mask = (1 << bitsPerCharacter) - 1;
        uint32_t bits = 0;
        std::string s;
        for (size_t i = 0; i < len; ++i) {
            bits = (bits << 8) | dataP[i];
            bitsAvail += 8;
            while (bitsAvail >= bitsPerCharacter) {
                bitsAvail -= bitsPerCharacter;
                size_t charIndex = (bits >> bitsAvail) & mask;
                if (charIndex < alphabetLength) {
                    s.push_back(alphabetUTF32[charIndex]);
                }
                else if (charIndex != mask) {
                    throw DeadlyImportError(parseErrorMessage);
                }
            }
        }
        return FIStringValue::create(std::move(s));
    }